

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

string * __thiscall
CppUnit::Message::detailAt_abi_cxx11_(string *__return_storage_ptr__,Message *this,int index)

{
  int iVar1;
  invalid_argument *this_00;
  const_reference pvVar2;
  int index_local;
  Message *this_local;
  
  if (-1 < index) {
    iVar1 = detailCount(this);
    if (index < iVar1) {
      pvVar2 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_details,(long)index);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
      return __return_storage_ptr__;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Message::detailAt() : invalid index");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string 
Message::detailAt( int index ) const
{
  if ( index < 0  ||  index >= detailCount() )
    throw std::invalid_argument( "Message::detailAt() : invalid index" );

  return m_details[ index ];
}